

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-predicate.c
# Opt level: O3

_Bool monster_is_esp_detectable(monster *mon)

{
  _Bool _Var1;
  bitflag flags [11];
  bitflag local_13 [11];
  
  flag_copy(local_13,mon->race->flags,0xb);
  if (mon->original_race != (monster_race *)0x0) {
    flag_inter(local_13,mon->original_race->flags,0xb);
  }
  _Var1 = flag_has_dbg(local_13,0xb,0x2a,"flags","RF_EMPTY_MIND");
  if ((!_Var1) &&
     ((_Var1 = flag_has_dbg(mon->race->flags,0xb,0x2b,"mon->race->flags","RF_WEIRD_MIND"), !_Var1 ||
      (mon->midx % 10 == 5)))) {
    return true;
  }
  return false;
}

Assistant:

bool monster_is_esp_detectable(const struct monster *mon)
{
	bitflag flags[RF_SIZE];
	rf_copy(flags, mon->race->flags);
	if (mon->original_race) {
		rf_inter(flags, mon->original_race->flags);
	}
	if (rf_has(flags, RF_EMPTY_MIND)) {
		/* Empty mind, no telepathy */
		return false;
	} else if (rf_has(mon->race->flags, RF_WEIRD_MIND)) {
		/* Weird mind, one in ten individuals are detectable */
		if ((mon->midx % 10) != 5) {
			/* Undetectable */
			return false;
		}
	}

	return true;
}